

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O3

void __thiscall
mp::SOLReader2<ExampleSOLHandler>::serror(SOLReader2<ExampleSOLHandler> *this,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vector<char,_std::allocator<char>_> buf;
  va_list args;
  allocator_type local_121;
  vector<char,_std::allocator<char>_> local_120;
  undefined8 local_108;
  vector<char,_std::allocator<char>_> *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_108 = 0x3000000010;
  local_100 = &buf;
  local_f8 = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar1 = vsnprintf((char *)0x0,0,format,&local_108);
  local_108 = 0x3000000010;
  local_100 = &buf;
  local_f8 = local_e8;
  std::vector<char,_std::allocator<char>_>::vector(&local_120,(long)(iVar1 + 1),&local_121);
  vsnprintf(local_120.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,(long)(iVar1 + 1),format,&local_108);
  if ((this->err_msg_)._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&this->err_msg_);
  }
  std::__cxx11::string::append((char *)&this->err_msg_);
  if (local_120.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_120.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SOLReader2<SOLHandler>::serror(
    const char* format, ...) {
  va_list args;
  va_start (args, format);
  auto n = std::vsnprintf (0, 0, format, args);
  va_end (args);
  va_start (args, format);
  std::vector<char> buf(n+1);
  auto n1 = std::vsnprintf (buf.data(), n+1, format, args);
  assert(n==n1);
  va_end (args);
  if (err_msg_.size())
    err_msg_ += '\n';
  err_msg_ += buf.data();
}